

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayerShapeConstraints.cpp
# Opt level: O2

RangeValue __thiscall CoreML::RangeValue::operator-(RangeValue *this,RangeValue *other)

{
  undefined8 extraout_RAX;
  size_t other_00;
  ostream *poVar1;
  runtime_error *this_00;
  RangeValue RVar2;
  string asStack_1d8 [32];
  RangeValue local_1b8;
  stringstream ss;
  ostream local_198 [376];
  
  if (other->_isUnbound == true) {
    if (this->_isUnbound == false) {
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      poVar1 = std::operator<<(local_198,"Subtracting unbound range ");
      ::operator<<(poVar1,other);
      poVar1 = std::operator<<(poVar1," from bound range ");
      ::operator<<(poVar1,this);
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(this_00,asStack_1d8);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    RangeValue(&local_1b8);
    RVar2._1_7_ = (int7)((ulong)extraout_RAX >> 8);
    RVar2._isUnbound = local_1b8._isUnbound;
    RVar2._val = local_1b8._val;
  }
  else {
    other_00 = value(other);
    RVar2 = operator-(this,other_00);
  }
  return RVar2;
}

Assistant:

RangeValue RangeValue::operator- (const RangeValue& other) const {
    if (other.isUnbound() && !(this->isUnbound())) {
        std::stringstream ss;
        ss << "Subtracting unbound range " << other << " from bound range " << *this;
        throw std::runtime_error(ss.str());
    }
    else if (other.isUnbound()) {
        // both unbound
        return RangeValue();
    }
    else {
        return (*this)-other.value();
    }
}